

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask17_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x11 | uVar2;
  uVar1 = uVar1 >> 0xf;
  out[1] = uVar1;
  uVar1 = in[2] << 2 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x13 | uVar1;
  uVar2 = uVar2 >> 0xd;
  out[2] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[2] = uVar2;
  uVar1 = in[5];
  out[2] = uVar1 << 0x15 | uVar2;
  uVar1 = uVar1 >> 0xb;
  out[3] = uVar1;
  uVar1 = in[6] << 6 | uVar1;
  out[3] = uVar1;
  uVar2 = in[7];
  out[3] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[4] = uVar2;
  uVar2 = in[8] << 8 | uVar2;
  out[4] = uVar2;
  uVar1 = in[9];
  out[4] = uVar1 << 0x19 | uVar2;
  uVar1 = uVar1 >> 7;
  out[5] = uVar1;
  uVar1 = in[10] << 10 | uVar1;
  out[5] = uVar1;
  uVar2 = in[0xb];
  out[5] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[6] = uVar2;
  uVar2 = in[0xc] << 0xc | uVar2;
  out[6] = uVar2;
  uVar1 = in[0xd];
  out[6] = uVar1 << 0x1d | uVar2;
  uVar1 = uVar1 >> 3;
  out[7] = uVar1;
  uVar1 = in[0xe] << 0xe | uVar1;
  out[7] = uVar1;
  uVar2 = in[0xf];
  out[7] = uVar2 << 0x1f | uVar1;
  out[8] = uVar2 >> 1;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask17_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (17 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (17 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (17 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (17 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (17 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (17 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (17 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (17 - 16);
  ++in;

  return out + 1;
}